

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParserManager.cpp
# Opt level: O2

void __thiscall
OpenMD::SectionParserManager::insert(SectionParserManager *this,SectionParser *sp,int priority)

{
  int iVar1;
  iterator iVar2;
  ostream *poVar3;
  const_iterator __position;
  SectionParserContextList *this_00;
  value_type local_50;
  
  iVar2 = findSectionParser(this,&sp->sectionName_);
  this_00 = &this->sectionParsers_;
  if (iVar2._M_node != (_List_node_base *)this_00) {
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&sp->sectionName_);
    poVar3 = std::operator<<(poVar3," section parser already exists");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_50.lineNo = 0;
  local_50.offset._M_off = 0;
  local_50.offset._M_state.__count = 0;
  local_50.offset._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_50.isActive = false;
  __position._M_node =
       (this_00->
       super__List_base<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  local_50.priority = priority;
  local_50.sectionParser = sp;
  if (__position._M_node == (_List_node_base *)this_00) {
    std::__cxx11::list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>
    ::push_back(this_00,&local_50);
  }
  else {
    for (; __position._M_node != (_List_node_base *)this_00;
        __position._M_node = (__position._M_node)->_M_next) {
      iVar1 = *(int *)&__position._M_node[1]._M_next;
      if (iVar1 == priority) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Priority ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,priority);
        poVar3 = std::operator<<(poVar3," already used");
        std::endl<char,std::char_traits<char>>(poVar3);
        return;
      }
      if (iVar1 != priority && priority <= iVar1) {
        std::__cxx11::
        list<OpenMD::SectionParserContext,_std::allocator<OpenMD::SectionParserContext>_>::insert
                  (this_00,__position,&local_50);
        return;
      }
    }
  }
  return;
}

Assistant:

void SectionParserManager::insert(SectionParser* sp, int priority) {
    SectionParserManager::iterator i;
    i = findSectionParser(sp->getSectionName());
    if (i != sectionParsers_.end()) {
      std::cerr << sp->getSectionName() << " section parser already exists"
                << std::endl;
    }

    SectionParserContext context;
    context.priority      = priority;
    context.sectionParser = sp;
    context.lineNo        = 0;
    context.offset        = 0;
    context.isActive      = false;

    if (sectionParsers_.empty()) {
      sectionParsers_.push_back(context);
    } else {
      for (i = sectionParsers_.begin(); i != sectionParsers_.end(); ++i) {
        if (i->priority == priority) {
          std::cerr << "Priority " << priority << " already used" << std::endl;
          return;
        } else if (i->priority > priority) {
          sectionParsers_.insert(i, context);
          break;
        }
      }
    }
  }